

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_lifetime_analyzer.cpp
# Opt level: O2

void duckdb::ColumnLifetimeAnalyzer::ExtractColumnBindings
               (Expression *expr,vector<duckdb::ColumnBinding,_true> *bindings)

{
  BoundColumnRefExpression *pBVar1;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  if ((expr->super_BaseExpression).type == BOUND_COLUMN_REF) {
    pBVar1 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&expr->super_BaseExpression);
    ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::push_back
              (&bindings->
                super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,
               &pBVar1->binding);
  }
  local_30._8_8_ = 0;
  local_18 = ::std::
             _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/column_lifetime_analyzer.cpp:55:46)>
             ::_M_invoke;
  local_20 = ::std::
             _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/column_lifetime_analyzer.cpp:55:46)>
             ::_M_manager;
  local_30._M_unused._M_object = bindings;
  ExpressionIterator::EnumerateChildren(expr,(function<void_(duckdb::Expression_&)> *)&local_30);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_30);
  return;
}

Assistant:

void ColumnLifetimeAnalyzer::ExtractColumnBindings(Expression &expr, vector<ColumnBinding> &bindings) {
	if (expr.GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		auto &bound_ref = expr.Cast<BoundColumnRefExpression>();
		bindings.push_back(bound_ref.binding);
	}
	ExpressionIterator::EnumerateChildren(expr, [&](Expression &child) { ExtractColumnBindings(child, bindings); });
}